

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_rando_world_edits.hpp
# Opt level: O2

void PatchRandoWorldEdits::remove_verla_soldiers_on_verla_spawn(World *world)

{
  bool bVar1;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &world[1]._map_connections.
                           super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl
                           .super__Vector_impl_data._M_start[3]._extra_byte_1,"verla");
  if (bVar1) {
    std::vector<Flag,std::allocator<Flag>>::emplace_back<Flag_const&>
              ((vector<Flag,std::allocator<Flag>> *)&world->_starting_flags,
               &FLAG_VERLA_WHITE_KNIGHTS_KILLED);
    std::vector<Flag,std::allocator<Flag>>::emplace_back<Flag_const&>
              ((vector<Flag,std::allocator<Flag>> *)&world->_starting_flags,
               &FLAG_VERLA_GOLDEN_KNIGHT_KILLED);
    return;
  }
  return;
}

Assistant:

static void remove_verla_soldiers_on_verla_spawn(World& world)
    {
        RandomizerWorld& randomizer_world = reinterpret_cast<RandomizerWorld&>(world);
        if(randomizer_world.spawn_location()->node_id() == "verla")
        {
            world.starting_flags().emplace_back(FLAG_VERLA_WHITE_KNIGHTS_KILLED);
            world.starting_flags().emplace_back(FLAG_VERLA_GOLDEN_KNIGHT_KILLED);
        }
    }